

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O3

void __thiscall ON_Linetype::Dump(ON_Linetype *this,ON_TextLog *dump)

{
  uint uVar1;
  int iVar2;
  ON_LinetypeSegment *pOVar3;
  long lVar4;
  ON_wString *src;
  wchar_t *pwVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  double dVar9;
  ON_wString usn;
  ON_UnitSystem us;
  ON_wString local_50;
  ON_UnitSystem local_48;
  
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,dump);
  uVar1 = (this->m_private->m_segments).m_count;
  ON_TextLog::Print(dump,"Segment count = %d\n",(ulong)uVar1);
  lVar4 = (long)(this->m_private->m_segments).m_count;
  if (lVar4 < 1) {
    dVar9 = 0.0;
  }
  else {
    dVar9 = 0.0;
    lVar6 = 0;
    do {
      dVar9 = dVar9 + *(double *)((long)&((this->m_private->m_segments).m_a)->m_length + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (lVar4 * 0x10 != lVar6);
  }
  ON_TextLog::Print(dump,"Pattern length = %g\n",dVar9);
  ON_TextLog::Print(dump,"Pattern = (");
  if (0 < (int)uVar1) {
    lVar4 = 0;
    do {
      pOVar3 = (this->m_private->m_segments).m_a;
      if (lVar4 != 0) {
        ON_TextLog::Print(dump,",");
      }
      iVar2 = *(int *)((long)&pOVar3->m_seg_type + lVar4);
      pcVar7 = "space";
      if (iVar2 != 2) {
        pcVar7 = "invalid";
      }
      if (iVar2 == 1) {
        pcVar7 = "line";
      }
      ON_TextLog::Print(dump,pcVar7);
      lVar4 = lVar4 + 0x10;
    } while ((ulong)uVar1 << 4 != lVar4);
  }
  ON_TextLog::Print(dump,")\n");
  pcVar7 = "Cap = Round\n";
  if (this->m_cap_style == Square) {
    pcVar7 = "Cap = Square\n";
  }
  pcVar8 = "Cap = Flat\n";
  if (this->m_cap_style != Flat) {
    pcVar8 = pcVar7;
  }
  ON_TextLog::Print(dump,pcVar8);
  pcVar7 = "Join = Round\n";
  if (this->m_join_style == Miter) {
    pcVar7 = "Join = Miter\n";
  }
  pcVar8 = "Join = Bevel\n";
  if (this->m_join_style != Bevel) {
    pcVar8 = pcVar7;
  }
  ON_TextLog::Print(dump,pcVar8);
  ON_TextLog::Print(dump,"Width = %d\n",this->m_width);
  ON_UnitSystem::ON_UnitSystem(&local_48,this->m_width_units);
  src = ON_UnitSystem::UnitSystemName(&local_48);
  ON_wString::ON_wString(&local_50,src);
  pwVar5 = ON_wString::Array(&local_50);
  ON_TextLog::Print(dump,"Width Units = %ls\n",pwVar5);
  if (0 < (this->m_private->m_taper_points).m_count) {
    ON_TextLog::Print(dump,"Taper count = %d\n");
  }
  ON_wString::~ON_wString(&local_50);
  ON_wString::~ON_wString(&local_48.m_custom_unit_name);
  return;
}

Assistant:

void ON_Linetype::Dump( ON_TextLog& dump ) const
{
  ON_ModelComponent::Dump(dump);
  const int segmentCount = SegmentCount();
  dump.Print( "Segment count = %d\n", segmentCount);
  dump.Print( "Pattern length = %g\n", PatternLength());
  dump.Print( "Pattern = (" );
  for( int i = 0; i < segmentCount; i++)
  {
    const ON_LinetypeSegment& seg = m_private->m_segments[i];
    if ( i )
      dump.Print(",");
    switch( seg.m_seg_type)
    {
    case ON_LinetypeSegment::eSegType::stLine:
      dump.Print( "line");
      break;
    case ON_LinetypeSegment::eSegType::stSpace:
      dump.Print( "space");
      break;
    default:
      dump.Print( "invalid");
      break;
    }
  }
  dump.Print(")\n");

  switch (m_cap_style)
  {
  case ON::LineCapStyle::Flat:
    dump.Print("Cap = Flat\n");
    break;
  case ON::LineCapStyle::Square:
    dump.Print("Cap = Square\n");
    break;
  case ON::LineCapStyle::Round:
  default:
    dump.Print("Cap = Round\n");
    break;
  }

  switch (m_join_style)
  {
  case ON::LineJoinStyle::Bevel:
    dump.Print("Join = Bevel\n");
    break;
  case ON::LineJoinStyle::Miter:
    dump.Print("Join = Miter\n");
    break;
  case ON::LineJoinStyle::Round:
  default:
    dump.Print("Join = Round\n");
    break;
  }

  dump.Print("Width = %d\n", Width());
  ON_UnitSystem us(WidthUnits());
  ON_wString usn = us.UnitSystemName();
  const wchar_t* s = usn.Array();
  dump.Print("Width Units = %ls\n", s);
  
  const ON_SimpleArray<ON_2dPoint>* taper = TaperPoints();
  if (taper && taper->Count()>0)
  {
    dump.Print("Taper count = %d\n", taper->Count());
  }
}